

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::OnConnect(RWSocket *this,uint16_t err)

{
  uint64_t *__k;
  int iVar1;
  CppNetBase *this_00;
  int iVar2;
  mapped_type *pmVar3;
  undefined6 in_register_00000032;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long *in_FS_OFFSET;
  bool bVar4;
  shared_ptr<cppnet::RWSocket> sock;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<cppnet::RWSocket> local_28;
  
  __connecting_socket_map::__tls_init();
  __k = &(this->super_Socket)._sock;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(*in_FS_OFFSET + -0x80),__k);
  LOCK();
  (this->_connecting)._M_base._M_i = false;
  UNLOCK();
  std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::RWSocket,void>
            ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::RWSocket>);
  if ((int)CONCAT62(in_register_00000032,err) == 0) {
    Socket::__all_socket_map::__tls_init();
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(*in_FS_OFFSET + -0x40),__k);
    (pmVar3->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         &local_38->super_Socket;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ,&local_30);
  }
  this_01 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_01->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_01->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_01->_M_use_count == 0;
  }
  this_00 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_00 == (CppNetBase *)0x0 | bVar4)) {
    local_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
    local_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_30._M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      }
    }
    CppNetBase::OnConnect(this_00,&local_28,err);
    if (local_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (err == 0) {
    (*(this->super_Socket)._vptr_Socket[7])(this);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

void RWSocket::OnConnect(uint16_t err) {
    __connecting_socket_map.erase(_sock);
    _connecting = false;
    auto sock = shared_from_this();
    if (err == CEC_SUCCESS) {
        __all_socket_map[_sock] = sock;
    }
    
    auto cppnet_base = _cppnet_base.lock();
    if (cppnet_base) {
        cppnet_base->OnConnect(sock, err);
    }

    if (err == CEC_SUCCESS) {
        Read();
    }
}